

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  size_t sVar4;
  PrimRef *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  BufferView<embree::Vec3fa> *pBVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  unsigned_long uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  size_t local_98;
  size_t local_90;
  uint local_40;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar11 = r->_begin;
  uVar23 = r->_end;
  if (uVar11 < uVar23) {
    auVar33._8_4_ = 0xff800000;
    auVar33._0_8_ = 0xff800000ff800000;
    auVar33._12_4_ = 0xff800000;
    auVar35._8_4_ = 0x7f800000;
    auVar35._0_8_ = 0x7f8000007f800000;
    auVar35._12_4_ = 0x7f800000;
    local_98 = 0;
    auVar37._8_4_ = 0xddccb9a2;
    auVar37._0_8_ = 0xddccb9a2ddccb9a2;
    auVar37._12_4_ = 0xddccb9a2;
    auVar38._8_4_ = 0x5dccb9a2;
    auVar38._0_8_ = 0x5dccb9a25dccb9a2;
    auVar38._12_4_ = 0x5dccb9a2;
    auVar36 = ZEXT1664(auVar35);
    auVar34 = ZEXT1664(auVar33);
    auVar29 = ZEXT1664(auVar35);
    auVar32 = ZEXT1664(auVar33);
    local_90 = k;
    do {
      if (uVar11 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar3 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar18 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar15 = *(long *)&(this->super_GridMesh).field_0x68 * uVar11;
        uVar13 = (ulong)*(uint *)(lVar3 + lVar15);
        if (uVar13 < uVar18) {
          uVar1 = *(ushort *)(lVar3 + 10 + lVar15);
          uVar10 = (ulong)uVar1;
          uVar19 = *(uint *)(lVar3 + 4 + lVar15);
          uVar2 = *(ushort *)(lVar3 + 8 + lVar15);
          uVar14 = (ulong)uVar2;
          if (((uint)uVar2 + uVar19 * (uVar1 - 1) + *(uint *)(lVar3 + lVar15)) - 1 < uVar18) {
            if (uVar1 != 0) {
              pBVar17 = (this->super_GridMesh).vertices.items;
              uVar18 = 0;
              do {
                if (uVar2 != 0) {
                  sVar4 = (pBVar17->super_RawBufferView).stride;
                  pauVar21 = (undefined1 (*) [16])
                             ((pBVar17->super_RawBufferView).ptr_ofs + sVar4 * uVar13);
                  uVar25 = uVar14;
                  do {
                    uVar8 = vcmpps_avx512vl(*pauVar21,auVar37,6);
                    uVar9 = vcmpps_avx512vl(*pauVar21,auVar38,1);
                    if ((~((ushort)uVar8 & (ushort)uVar9) & 7) != 0) goto LAB_01f11501;
                    pauVar21 = (undefined1 (*) [16])(*pauVar21 + sVar4);
                    uVar25 = uVar25 - 1;
                  } while (uVar25 != 0);
                }
                uVar18 = uVar18 + 1;
                uVar13 = uVar13 + uVar19;
              } while (uVar18 != uVar10);
              if (uVar1 == 1) goto LAB_01f11501;
            }
            uVar19 = 0;
            uVar18 = uVar14;
            do {
              if ((short)uVar14 == 1) {
                uVar14 = 1;
              }
              else {
                uVar13 = (ulong)uVar19 + 3;
                uVar12 = 0;
                do {
                  uVar25 = (ulong)uVar12;
                  uVar10 = (ulong)(this->super_GridMesh).super_Geometry.numTimeSteps;
                  uVar1 = *(ushort *)(lVar3 + 10 + lVar15);
                  local_40 = (uint)uVar14;
                  auVar40 = auVar35;
                  auVar42 = auVar33;
                  if (uVar10 != 0) {
                    uVar26 = (ulong)uVar1;
                    if (uVar13 < uVar1) {
                      uVar26 = uVar13;
                    }
                    uVar16 = uVar25 + 3;
                    if (uVar14 <= uVar25 + 3) {
                      uVar16 = uVar14;
                    }
                    uVar22 = 0;
                    auVar39 = ZEXT1664(auVar33);
                    auVar41 = ZEXT1664(auVar35);
                    do {
                      if (uVar19 < uVar1) {
                        pBVar17 = (this->super_GridMesh).vertices.items + uVar22;
                        uVar24 = (ulong)uVar19;
                        do {
                          if (uVar12 < local_40) {
                            sVar4 = (pBVar17->super_RawBufferView).stride;
                            pauVar21 = (undefined1 (*) [16])
                                       ((pBVar17->super_RawBufferView).ptr_ofs +
                                       (*(uint *)(lVar3 + lVar15) + uVar25 +
                                       *(uint *)(lVar3 + 4 + lVar15) * uVar24) * sVar4);
                            uVar20 = uVar25;
                            do {
                              auVar40 = *pauVar21;
                              uVar8 = vcmpps_avx512vl(auVar40,auVar37,6);
                              uVar9 = vcmpps_avx512vl(auVar40,auVar38,1);
                              uVar14 = uVar18;
                              if ((~((ushort)uVar8 & (ushort)uVar9) & 7) != 0) goto LAB_01f114b8;
                              auVar42 = vminps_avx(auVar41._0_16_,auVar40);
                              auVar41 = ZEXT1664(auVar42);
                              auVar40 = vmaxps_avx(auVar39._0_16_,auVar40);
                              auVar39 = ZEXT1664(auVar40);
                              uVar20 = uVar20 + 1;
                              pauVar21 = (undefined1 (*) [16])(*pauVar21 + sVar4);
                            } while (uVar20 < uVar16);
                          }
                          uVar24 = uVar24 + 1;
                        } while (uVar24 < uVar26);
                      }
                      auVar42 = auVar39._0_16_;
                      auVar40 = auVar41._0_16_;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar10);
                  }
                  aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                          vinsertps_avx(auVar40,ZEXT416(geomID),0x30);
                  aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                          vinsertps_avx(auVar42,ZEXT416((uint)local_90),0x30);
                  auVar40 = vminps_avx(auVar36._0_16_,(undefined1  [16])aVar6);
                  auVar36 = ZEXT1664(auVar40);
                  auVar40 = vmaxps_avx(auVar34._0_16_,(undefined1  [16])aVar7);
                  auVar34 = ZEXT1664(auVar40);
                  auVar42._0_4_ = aVar6.x + aVar7.x;
                  auVar42._4_4_ = aVar6.y + aVar7.y;
                  auVar42._8_4_ = aVar6.z + aVar7.z;
                  auVar42._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
                  auVar40 = vminps_avx(auVar29._0_16_,auVar42);
                  auVar29 = ZEXT1664(auVar40);
                  auVar40 = vmaxps_avx(auVar32._0_16_,auVar42);
                  auVar32 = ZEXT1664(auVar40);
                  local_98 = local_98 + 1;
                  sgrids->items[local_90] =
                       (SubGridBuildData)
                       ((ulong)(uVar12 & 0xfffe | (uint)(local_40 <= uVar12 + 2) << 0xf) |
                        uVar11 << 0x20 |
                       (ulong)(uVar19 << 0x10 | (uint)((uint)uVar1 <= uVar19 + 2) << 0x1f));
                  pPVar5 = prims->items;
                  pPVar5[local_90].upper.field_0.field_1 = aVar7;
                  pPVar5[local_90].lower.field_0.field_1 = aVar6;
                  uVar14 = (ulong)*(ushort *)(lVar3 + 8 + lVar15);
                  local_90 = local_90 + 1;
LAB_01f114b8:
                  uVar12 = uVar12 + 2;
                  uVar18 = uVar14;
                } while (uVar12 < (int)uVar14 - 1U);
                uVar10 = (ulong)*(ushort *)(lVar3 + 10 + lVar15);
              }
              uVar19 = uVar19 + 2;
            } while (uVar19 < (int)uVar10 - 1U);
            uVar23 = r->_end;
          }
        }
      }
LAB_01f11501:
      aVar30 = auVar32._0_16_;
      aVar27 = auVar29._0_16_;
      aVar31 = auVar34._0_16_;
      aVar28 = auVar36._0_16_;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar23);
  }
  else {
    aVar28.m128[2] = INFINITY;
    aVar28._0_8_ = 0x7f8000007f800000;
    aVar28.m128[3] = INFINITY;
    aVar31.m128[2] = -INFINITY;
    aVar31._0_8_ = 0xff800000ff800000;
    aVar31.m128[3] = -INFINITY;
    local_98 = 0;
    aVar27 = aVar28;
    aVar30 = aVar31;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar28;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar30;
  __return_storage_ptr__->end = local_98;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }